

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O3

char * monster_blow_method_action(blow_method *method,wchar_t midx)

{
  byte bVar1;
  blow_message *pbVar2;
  uint32_t uVar3;
  int iVar4;
  monster *mon;
  char *pcVar5;
  ushort **ppuVar6;
  byte bVar7;
  wchar_t mode;
  byte *pbVar8;
  byte *__s;
  size_t end;
  char punct [8];
  char m_name [80];
  char buf [1024];
  size_t local_498;
  char local_490 [88];
  char local_438 [1032];
  
  builtin_strncpy(local_490,".!?;:,\'",8);
  mon = (monster *)0x0;
  memset(local_438,0,0x400);
  local_498 = 0;
  uVar3 = Rand_div(method->num_messages);
  pbVar2 = method->messages;
  if (L'\0' < midx) {
    mon = cave_monster(cave,midx);
  }
  for (; uVar3 != 0; uVar3 = uVar3 - 1) {
    pbVar2 = pbVar2->next;
  }
  __s = (byte *)pbVar2->act_msg;
  pcVar5 = strchr((char *)__s,0x7b);
  if (pcVar5 != (char *)0x0) {
    do {
      strnfcat(local_438,0x400,&local_498,"%.*s",(ulong)(uint)((int)pcVar5 - (int)__s),__s);
      __s = (byte *)(pcVar5 + 1);
      bVar1 = pcVar5[1];
      if (bVar1 != 0) {
        ppuVar6 = __ctype_b_loc();
        pbVar8 = (byte *)(pcVar5 + 2);
        bVar7 = bVar1;
        do {
          if ((*(byte *)((long)*ppuVar6 + (ulong)bVar7 * 2 + 1) & 4) == 0) {
            if (bVar7 != 0x7d) break;
            iVar4 = strncmp((char *)__s,"target",6);
            if (iVar4 == 0) {
              if (L'\0' < midx) {
                pcVar5 = strchr(local_490,(int)(char)*pbVar8);
                mode = (uint)(pcVar5 == (char *)0x0) << 9 | 0x15;
LAB_00165efd:
                monster_desc(local_490 + 8,0x50,mon,mode);
                strnfcat(local_438,0x400,&local_498,"%s",local_490 + 8);
                __s = pbVar8;
                break;
              }
              pcVar5 = "you";
            }
            else {
              iVar4 = strncmp((char *)__s,"oftarget",8);
              if (iVar4 == 0) {
                if (L'\0' < midx) {
                  mode = L'\x17';
                  goto LAB_00165efd;
                }
                pcVar5 = "your";
              }
              else {
                __s = pbVar8;
                if (((bVar1 != 0x68) || (pcVar5[2] != 'a')) || (pcVar5[3] != 's')) break;
                if (midx < L'\x01') {
                  pcVar5 = "have";
                }
                else {
                  pcVar5 = "has";
                }
              }
            }
            strnfcat(local_438,0x400,&local_498,pcVar5);
            __s = pbVar8;
            break;
          }
          bVar7 = *pbVar8;
          pbVar8 = pbVar8 + 1;
        } while (bVar7 != 0);
      }
      pcVar5 = strchr((char *)__s,0x7b);
    } while (pcVar5 != (char *)0x0);
  }
  strnfcat(local_438,0x400,&local_498,"%s",__s);
  pcVar5 = string_make(local_438);
  return pcVar5;
}

Assistant:

char *monster_blow_method_action(const struct blow_method *method, int midx)
{
	const char punct[] = ".!?;:,'";
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;
	struct monster *t_mon = NULL;

	int choice = randint0(method->num_messages);
	const struct blow_message *msg = method->messages;

	/* Get the target monster, if any */
	if (midx > 0) {
		t_mon = cave_monster(cave, midx);
	}

	/* Pick a message */
	while (choice--) {
		msg = msg->next;
	}
	in_cursor = msg->act_msg;

	/* Add info to the message */
	next = strchr(in_cursor, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;

			switch (blow_tag_lookup(tag)) {
				case BLOW_TAG_TARGET: {
					char m_name[80];
					if (midx > 0) {
						int mdesc_mode = MDESC_TARG;

						if (!strchr(punct, *in_cursor)) {
							mdesc_mode |= MDESC_COMMA;
						}
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							mdesc_mode);
						strnfcat(buf, sizeof(buf),
							&end, "%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "you");
					}
					break;
				}
				case BLOW_TAG_OF_TARGET: {
					char m_name[80];
					if (midx > 0) {
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							MDESC_TARG | MDESC_POSS);
						strnfcat(buf, sizeof(buf), &end, "%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "your");
					}
					break;
				}
				case BLOW_TAG_HAS: {
					if (midx > 0) {
						strnfcat(buf, sizeof(buf), &end, "has");
					} else {
						strnfcat(buf, sizeof(buf), &end, "have");
					}
					break;
				}

				default: {
					break;
				}
			}
		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);
	return string_make(buf);
}